

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

bool re2::ParseEscape(StringPiece *s,Rune *rp,RegexpStatus *status,int rune_max)

{
  const_pointer str;
  int iVar1;
  int iVar2;
  size_type sVar3;
  const_reference pcVar4;
  const_pointer pcVar5;
  int in_ECX;
  RegexpStatus *in_RDX;
  int *in_RSI;
  StringPiece *in_RDI;
  int nhex;
  int code;
  Rune c1;
  Rune c;
  char *begin;
  int in_stack_000000f0;
  RegexpStatus *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int iVar6;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  StringPiece local_50;
  StringPiece local_40;
  const_pointer local_30;
  int local_24;
  RegexpStatus *local_20;
  int *local_18;
  StringPiece *local_10;
  bool local_1;
  
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_30 = StringPiece::data(in_RDI);
  sVar3 = StringPiece::size(local_10);
  if ((sVar3 == 0) || (pcVar4 = StringPiece::operator[](local_10,0), *pcVar4 != '\\')) {
    RegexpStatus::set_code(local_20,kRegexpInternalError);
    StringPiece::StringPiece(&local_40);
    RegexpStatus::set_error_arg(local_20,&local_40);
    return false;
  }
  sVar3 = StringPiece::size(local_10);
  if (sVar3 < 2) {
    RegexpStatus::set_code(local_20,kRegexpTrailingBackslash);
    StringPiece::StringPiece(&local_50);
    RegexpStatus::set_error_arg(local_20,&local_50);
    return false;
  }
  StringPiece::remove_prefix(local_10,1);
  iVar1 = StringPieceToRune((Rune *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                            (StringPiece *)
                            CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                            in_stack_ffffffffffffff98);
  if (iVar1 < 0) {
    return false;
  }
  switch(in_stack_ffffffffffffffac) {
  case 0x30:
switchD_0023dc55_caseD_30:
    in_stack_ffffffffffffffac = in_stack_ffffffffffffffac + -0x30;
    sVar3 = StringPiece::size(local_10);
    if (sVar3 != 0) {
      pcVar4 = StringPiece::operator[](local_10,0);
      iVar1 = (int)*pcVar4;
      if ((0x2f < iVar1) && (iVar1 < 0x38)) {
        in_stack_ffffffffffffffac = in_stack_ffffffffffffffac * 8 + iVar1 + -0x30;
        StringPiece::remove_prefix(local_10,1);
        sVar3 = StringPiece::size(local_10);
        if (sVar3 != 0) {
          pcVar4 = StringPiece::operator[](local_10,0);
          iVar1 = (int)*pcVar4;
          if ((0x2f < iVar1) && (iVar1 < 0x38)) {
            in_stack_ffffffffffffffac = in_stack_ffffffffffffffac * 8 + iVar1 + -0x30;
            StringPiece::remove_prefix(local_10,1);
          }
        }
      }
    }
    if (in_stack_ffffffffffffffac <= local_24) {
      *local_18 = in_stack_ffffffffffffffac;
      return true;
    }
    goto LAB_0023e079;
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
    sVar3 = StringPiece::size(local_10);
    if (((sVar3 != 0) && (pcVar4 = StringPiece::operator[](local_10,0), '/' < *pcVar4)) &&
       (pcVar4 = StringPiece::operator[](local_10,0), *pcVar4 < '8'))
    goto switchD_0023dc55_caseD_30;
    goto LAB_0023e079;
  default:
    if (((in_stack_ffffffffffffffac < 0x80) &&
        (iVar1 = isalpha(in_stack_ffffffffffffffac), iVar1 == 0)) &&
       (iVar1 = isdigit(in_stack_ffffffffffffffac), iVar1 == 0)) {
      *local_18 = in_stack_ffffffffffffffac;
      return true;
    }
    goto LAB_0023e079;
  case 0x61:
    *local_18 = 7;
    local_1 = true;
    break;
  case 0x66:
    *local_18 = 0xc;
    local_1 = true;
    break;
  case 0x6e:
    *local_18 = 10;
    local_1 = true;
    break;
  case 0x72:
    *local_18 = 0xd;
    local_1 = true;
    break;
  case 0x74:
    *local_18 = 9;
    local_1 = true;
    break;
  case 0x76:
    *local_18 = 0xb;
    local_1 = true;
    break;
  case 0x78:
    sVar3 = StringPiece::size(local_10);
    if (sVar3 != 0) {
      iVar1 = StringPieceToRune((Rune *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8
                                                ),
                                (StringPiece *)
                                CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                                in_stack_ffffffffffffff98);
      if (iVar1 < 0) {
        return false;
      }
      if (in_stack_ffffffffffffffac == 0x7b) {
        iVar1 = StringPieceToRune((Rune *)CONCAT44(0x7b,in_stack_ffffffffffffffa8),
                                  (StringPiece *)
                                  CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                                  in_stack_ffffffffffffff98);
        if (iVar1 < 0) {
          return false;
        }
        iVar1 = 0;
        iVar6 = 0;
        while (iVar2 = IsHex(in_stack_ffffffffffffffac), iVar2 != 0) {
          iVar1 = iVar1 + 1;
          iVar2 = UnHex(in_stack_000000f0);
          iVar6 = iVar6 * 0x10 + iVar2;
          if ((local_24 < iVar6) || (sVar3 = StringPiece::size(local_10), sVar3 == 0))
          goto LAB_0023e079;
          iVar2 = StringPieceToRune((Rune *)CONCAT44(in_stack_ffffffffffffffac,
                                                     in_stack_ffffffffffffffa8),
                                    (StringPiece *)CONCAT44(iVar6,iVar1),in_stack_ffffffffffffff98);
          if (iVar2 < 0) {
            return false;
          }
        }
        if ((in_stack_ffffffffffffffac == 0x7d) && (iVar1 != 0)) {
          *local_18 = iVar6;
          return true;
        }
      }
      else {
        sVar3 = StringPiece::size(local_10);
        if (sVar3 != 0) {
          iVar1 = StringPieceToRune((Rune *)CONCAT44(in_stack_ffffffffffffffac,
                                                     in_stack_ffffffffffffffa8),
                                    (StringPiece *)
                                    CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                                    in_stack_ffffffffffffff98);
          if (iVar1 < 0) {
            return false;
          }
          iVar1 = IsHex(in_stack_ffffffffffffffac);
          if ((iVar1 != 0) && (iVar1 = IsHex(in_stack_ffffffffffffffa8), iVar1 != 0)) {
            iVar1 = UnHex(in_stack_000000f0);
            iVar6 = UnHex(in_stack_000000f0);
            *local_18 = iVar1 * 0x10 + iVar6;
            return true;
          }
        }
      }
    }
LAB_0023e079:
    RegexpStatus::set_code(local_20,kRegexpBadEscape);
    str = local_30;
    pcVar5 = StringPiece::data(local_10);
    StringPiece::StringPiece
              ((StringPiece *)&stack0xffffffffffffff90,str,(long)pcVar5 - (long)local_30);
    RegexpStatus::set_error_arg(local_20,(StringPiece *)&stack0xffffffffffffff90);
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool ParseEscape(StringPiece* s, Rune* rp,
                        RegexpStatus* status, int rune_max) {
  const char* begin = s->data();
  if (s->size() < 1 || (*s)[0] != '\\') {
    // Should not happen - caller always checks.
    status->set_code(kRegexpInternalError);
    status->set_error_arg(StringPiece());
    return false;
  }
  if (s->size() < 2) {
    status->set_code(kRegexpTrailingBackslash);
    status->set_error_arg(StringPiece());
    return false;
  }
  Rune c, c1;
  s->remove_prefix(1);  // backslash
  if (StringPieceToRune(&c, s, status) < 0)
    return false;
  int code;
  switch (c) {
    default:
      if (c < Runeself && !isalpha(c) && !isdigit(c)) {
        // Escaped non-word characters are always themselves.
        // PCRE is not quite so rigorous: it accepts things like
        // \q, but we don't.  We once rejected \_, but too many
        // programs and people insist on using it, so allow \_.
        *rp = c;
        return true;
      }
      goto BadEscape;

    // Octal escapes.
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
      // Single non-zero octal digit is a backreference; not supported.
      if (s->size() == 0 || (*s)[0] < '0' || (*s)[0] > '7')
        goto BadEscape;
      FALLTHROUGH_INTENDED;
    case '0':
      // consume up to three octal digits; already have one.
      code = c - '0';
      if (s->size() > 0 && '0' <= (c = (*s)[0]) && c <= '7') {
        code = code * 8 + c - '0';
        s->remove_prefix(1);  // digit
        if (s->size() > 0) {
          c = (*s)[0];
          if ('0' <= c && c <= '7') {
            code = code * 8 + c - '0';
            s->remove_prefix(1);  // digit
          }
        }
      }
      if (code > rune_max)
        goto BadEscape;
      *rp = code;
      return true;

    // Hexadecimal escapes
    case 'x':
      if (s->size() == 0)
        goto BadEscape;
      if (StringPieceToRune(&c, s, status) < 0)
        return false;
      if (c == '{') {
        // Any number of digits in braces.
        // Update n as we consume the string, so that
        // the whole thing gets shown in the error message.
        // Perl accepts any text at all; it ignores all text
        // after the first non-hex digit.  We require only hex digits,
        // and at least one.
        if (StringPieceToRune(&c, s, status) < 0)
          return false;
        int nhex = 0;
        code = 0;
        while (IsHex(c)) {
          nhex++;
          code = code * 16 + UnHex(c);
          if (code > rune_max)
            goto BadEscape;
          if (s->size() == 0)
            goto BadEscape;
          if (StringPieceToRune(&c, s, status) < 0)
            return false;
        }
        if (c != '}' || nhex == 0)
          goto BadEscape;
        *rp = code;
        return true;
      }
      // Easy case: two hex digits.
      if (s->size() == 0)
        goto BadEscape;
      if (StringPieceToRune(&c1, s, status) < 0)
        return false;
      if (!IsHex(c) || !IsHex(c1))
        goto BadEscape;
      *rp = UnHex(c) * 16 + UnHex(c1);
      return true;

    // C escapes.
    case 'n':
      *rp = '\n';
      return true;
    case 'r':
      *rp = '\r';
      return true;
    case 't':
      *rp = '\t';
      return true;

    // Less common C escapes.
    case 'a':
      *rp = '\a';
      return true;
    case 'f':
      *rp = '\f';
      return true;
    case 'v':
      *rp = '\v';
      return true;

    // This code is disabled to avoid misparsing
    // the Perl word-boundary \b as a backspace
    // when in POSIX regexp mode.  Surprisingly,
    // in Perl, \b means word-boundary but [\b]
    // means backspace.  We don't support that:
    // if you want a backspace embed a literal
    // backspace character or use \x08.
    //
    // case 'b':
    //   *rp = '\b';
    //   return true;
  }

  LOG(DFATAL) << "Not reached in ParseEscape.";

BadEscape:
  // Unrecognized escape sequence.
  status->set_code(kRegexpBadEscape);
  status->set_error_arg(
      StringPiece(begin, static_cast<size_t>(s->data() - begin)));
  return false;
}